

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O2

void __thiscall soplex::DSVectorBase<double>::setMax(DSVectorBase<double> *this,int newmax)

{
  int iVar1;
  
  iVar1 = (this->super_SVectorBase<double>).memused;
  if (newmax < iVar1) {
    newmax = iVar1;
  }
  spx_realloc<soplex::Nonzero<double>*>(&this->theelem,newmax);
  (this->super_SVectorBase<double>).m_elem = this->theelem;
  (this->super_SVectorBase<double>).memsize = newmax;
  (this->super_SVectorBase<double>).memused = iVar1;
  return;
}

Assistant:

inline
void DSVectorBase<Real>::setMax(int newmax)
{
   int siz = size();
   int len = (newmax < siz) ? siz : newmax;

   spx_realloc(theelem, len);
   setMem(len, theelem);
   // reset 'size' to old size since the above call to setMem() sets 'size' to 0
   set_size(siz);
}